

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O3

GLuint __thiscall
deqp::gls::LifetimeTests::details::ShaderProgramAttacher::getAttachment
          (ShaderProgramAttacher *this,GLuint program)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar2;
  GLint shaderType;
  GLsizei numShaders;
  GLuint shaders [2];
  int local_38;
  int local_34;
  GLuint local_30 [2];
  
  local_30[0] = 0;
  local_30[1] = 0;
  local_34 = 0;
  iVar1 = (*((this->super_Attacher).super_ContextWrapper.m_ctx.m_renderCtx)->_vptr_RenderContext[3])
                    ();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x778))(program,2,&local_34,local_30);
  if (0 < local_34) {
    lVar2 = 0;
    do {
      local_38 = 0;
      iVar1 = (*((this->super_Attacher).super_ContextWrapper.m_ctx.m_renderCtx)->_vptr_RenderContext
                [3])();
      (**(code **)(CONCAT44(extraout_var_00,iVar1) + 0xa70))(local_30[lVar2],0x8b4f,&local_38);
      if (local_38 == 0x8b30) {
        return local_30[lVar2];
      }
      lVar2 = lVar2 + 1;
      iVar1 = local_34;
      if (1 < local_34) {
        iVar1 = 2;
      }
    } while (lVar2 < iVar1);
  }
  return 0;
}

Assistant:

GLuint ShaderProgramAttacher::getAttachment (GLuint program)
{
	GLuint			shaders[2]	= { 0, 0 };
	const GLsizei	shadersLen	= DE_LENGTH_OF_ARRAY(shaders);
	GLsizei			numShaders	= 0;
	GLuint			ret			= 0;

	gl().getAttachedShaders(program, shadersLen, &numShaders, shaders);

	// There should ever be at most one attached shader in normal use, but if
	// something is wrong, the temporary vertex shader might not have been
	// detached properly, so let's find the fragment shader explicitly.
	for (int ndx = 0; ndx < de::min<GLsizei>(shadersLen, numShaders); ++ndx)
	{
		GLint shaderType = GL_NONE;
		gl().getShaderiv(shaders[ndx], GL_SHADER_TYPE, &shaderType);

		if (shaderType == GL_FRAGMENT_SHADER)
		{
			ret = shaders[ndx];
			break;
		}
	}

	return ret;
}